

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,IfStatement *statement)

{
  Expression *pEVar1;
  CompoundStatement *pCVar2;
  ElifStatement *pEVar3;
  ElseStatement *pEVar4;
  IfStatement *statement_local;
  PrettyPrinter *this_local;
  
  std::operator<<((ostream *)&this->field_0x20,"if ");
  pEVar1 = IfStatement::getExpression(statement);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  std::operator<<((ostream *)&this->field_0x20,":\n");
  indent(this);
  pCVar2 = IfStatement::getStatements(statement);
  (**(pCVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar2,this);
  dedent(this);
  pEVar3 = IfStatement::getElifStatement(statement);
  if (pEVar3 == (ElifStatement *)0x0) {
    pEVar4 = IfStatement::getElseStatement(statement);
    if (pEVar4 != (ElseStatement *)0x0) {
      pEVar4 = IfStatement::getElseStatement(statement);
      (**(pEVar4->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar4,this);
    }
  }
  else {
    pEVar3 = IfStatement::getElifStatement(statement);
    (**(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar3,this);
  }
  return;
}

Assistant:

void PrettyPrinter::visit(IfStatement* statement) {
    output << "if ";
    statement->getExpression()->accept(this);
    output << ":\n";
    indent();
    statement->getStatements()->accept(this);
    dedent();

    if (statement->getElifStatement()) {
        statement->getElifStatement()->accept(this);
    } else if (statement->getElseStatement()) {
        statement->getElseStatement()->accept(this);
    }
}